

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v5::vprint(FILE *f,string_view format_str,format_args args)

{
  undefined **local_230;
  undefined1 *local_228;
  size_t sStack_220;
  undefined8 local_218;
  undefined1 local_210 [504];
  
  sStack_220 = 0;
  local_230 = &PTR_grow_00144ae0;
  local_218 = 500;
  local_228 = local_210;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_230,format_str,
             args.
             super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            );
  fwrite(local_228,1,sStack_220,(FILE *)f);
  local_230 = &PTR_grow_00144ae0;
  if (local_228 != local_210) {
    operator_delete(local_228);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE *f, string_view format_str, format_args args) {
  memory_buffer buffer;
  vformat_to(buffer, format_str, args);
  std::fwrite(buffer.data(), 1, buffer.size(), f);
}